

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void heap_init(long n)

{
  long local_18;
  long p;
  long n_local;
  
  allocate_heap(n);
  _heap_size = 0;
  for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
    _heap[local_18].idx = 0;
  }
  return;
}

Assistant:

void  heap_init( long  n )
{
  register long  p;

  allocate_heap( n );
  _heap_size = 0;
  for( p = 0;  p < n;  p++ )
  { 
    heap_idx( p ) = 0;
  }
 
}